

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersector1<4,_1048576,_false,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  undefined1 (*pauVar12) [12];
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar16;
  float **ppfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  long lVar21;
  ulong uVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  byte bVar33;
  BaseNode *node;
  ulong uVar34;
  float *pfVar35;
  uint uVar36;
  byte bVar37;
  undefined4 uVar38;
  ulong *puVar39;
  undefined1 auVar40 [8];
  Scene *pSVar41;
  uint *puVar42;
  int iVar43;
  ulong uVar44;
  ulong uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar59;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  byte bVar60;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  float fVar61;
  byte bVar72;
  byte bVar74;
  byte bVar75;
  float fVar73;
  float fVar76;
  float fVar77;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar78;
  uint uVar79;
  uint uVar89;
  uint uVar90;
  vint4 ai_1;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar91;
  uint uVar92;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  uint uVar93;
  uint uVar98;
  uint uVar99;
  vint4 bi;
  undefined1 auVar94 [16];
  uint uVar100;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar101;
  uint uVar102;
  float fVar105;
  uint uVar106;
  float fVar107;
  uint uVar108;
  float fVar109;
  uint uVar110;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  uint uVar111;
  uint uVar114;
  uint uVar115;
  vint4 ai;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar116;
  uint uVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar120;
  float fVar121;
  float fVar123;
  float fVar124;
  undefined1 auVar122 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar139;
  float fVar142;
  undefined1 auVar137 [16];
  float fVar140;
  float fVar141;
  float fVar143;
  undefined1 auVar138 [16];
  float fVar144;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar145 [16];
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar150 [16];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_c5c;
  float local_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  undefined1 local_c48 [8];
  float fStack_c40;
  float fStack_c3c;
  undefined8 local_c38;
  float fStack_c30;
  float fStack_c2c;
  float local_c28;
  float fStack_c24;
  float fStack_c20;
  float fStack_c1c;
  float local_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  uint *local_c00;
  Scene *local_bf8;
  RayQueryContext *local_bf0;
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  undefined1 local_bd8 [8];
  float fStack_bd0;
  float fStack_bcc;
  float local_bc8;
  float fStack_bc4;
  float fStack_bc0;
  float fStack_bbc;
  undefined4 local_bb8;
  undefined4 local_bb4;
  undefined4 local_bb0;
  undefined4 local_bac;
  undefined4 local_ba8;
  undefined4 local_ba4;
  uint local_ba0;
  uint local_b9c;
  uint local_b98;
  RTCFilterFunctionNArguments local_b88;
  undefined8 local_b58;
  undefined8 uStack_b50;
  long local_b40;
  undefined8 local_b38;
  float fStack_b30;
  float fStack_b2c;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  undefined1 local_b18 [8];
  float fStack_b10;
  float fStack_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  ulong local_ae8;
  ulong local_ae0;
  ulong local_ad8;
  ulong *local_ad0;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  undefined1 local_a38 [12];
  float fStack_a2c;
  undefined1 local_a28 [12];
  float fStack_a1c;
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [8];
  float fStack_9a0;
  float fStack_99c;
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  undefined8 local_8d8;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  undefined8 local_8a8;
  float fStack_8a0;
  float fStack_89c;
  undefined8 local_898;
  float fStack_890;
  float fStack_88c;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined1 local_868 [16];
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  undefined1 local_848 [16];
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  ulong local_7d8 [245];
  undefined1 auVar125 [12];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_7d8[0] != 8) && (local_8e8 = ray->tfar, 0.0 <= local_8e8)) {
    local_ad0 = local_7d8 + 1;
    local_928 = (ray->org).field_0.m128[0];
    local_938 = (ray->org).field_0.m128[1];
    local_8f8 = (ray->org).field_0.m128[2];
    fVar59 = *(float *)((long)&(ray->org).field_0 + 0xc);
    aVar16 = (ray->dir).field_0.field_1;
    auVar46._4_4_ = -(uint)(ABS(aVar16.y) < DAT_01f4bd50._4_4_);
    auVar46._0_4_ = -(uint)(ABS(aVar16.x) < (float)DAT_01f4bd50);
    auVar46._8_4_ = -(uint)(ABS(aVar16.z) < DAT_01f4bd50._8_4_);
    auVar46._12_4_ = -(uint)(ABS(aVar16.field_3.w) < DAT_01f4bd50._12_4_);
    auVar80 = blendvps((undefined1  [16])aVar16,_DAT_01f4bd50,auVar46);
    local_908 = 0.0;
    if (0.0 <= fVar59) {
      local_908 = fVar59;
    }
    auVar46 = rcpps(auVar46,auVar80);
    local_948 = auVar46._0_4_;
    local_958 = auVar46._4_4_;
    local_918 = auVar46._8_4_;
    local_948 = (1.0 - auVar80._0_4_ * local_948) * local_948 + local_948;
    local_958 = (1.0 - auVar80._4_4_ * local_958) * local_958 + local_958;
    local_918 = (1.0 - auVar80._8_4_ * local_918) * local_918 + local_918;
    local_ad8 = (ulong)(local_948 < 0.0) << 2;
    uVar13 = (ulong)(local_958 < 0.0) * 4 + 8;
    local_ae8 = (ulong)(local_918 < 0.0);
    uVar14 = local_ae8 * 4 + 0x10;
    uVar44 = local_ad8 ^ 4;
    local_7e8 = mm_lookupmask_ps._0_8_;
    uStack_7e0 = mm_lookupmask_ps._8_8_;
    local_868 = mm_lookupmask_ps._240_16_;
    auVar80._8_4_ = 0xffffffff;
    auVar80._0_8_ = 0xffffffffffffffff;
    auVar80._12_4_ = 0xffffffff;
    fStack_944 = local_948;
    fStack_940 = local_948;
    fStack_93c = local_948;
    fStack_8e4 = local_8e8;
    fStack_8e0 = local_8e8;
    fStack_8dc = local_8e8;
    fStack_8f4 = local_8f8;
    fStack_8f0 = local_8f8;
    fStack_8ec = local_8f8;
    fStack_904 = local_908;
    fStack_900 = local_908;
    fStack_8fc = local_908;
    fStack_914 = local_918;
    fStack_910 = local_918;
    fStack_90c = local_918;
    fStack_924 = local_928;
    fStack_920 = local_928;
    fStack_91c = local_928;
    fStack_934 = local_938;
    fStack_930 = local_938;
    fStack_92c = local_938;
    fStack_954 = local_958;
    fStack_950 = local_958;
    fStack_94c = local_958;
LAB_006af1b4:
    if (local_ad0 != local_7d8) {
      uVar45 = local_ad0[-1];
      local_ad0 = local_ad0 + -1;
      while ((uVar45 & 8) == 0) {
        uVar34 = uVar45 & 0xfffffffffffffff0;
        puVar39 = (ulong *)(uVar34 + 0x20);
        if (uVar34 == 0) {
          puVar39 = (ulong *)0x0;
        }
        uVar45 = *puVar39;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = uVar45;
        uVar15 = *(undefined8 *)((long)puVar39 + 4);
        bVar37 = (byte)uVar45;
        bVar60 = (byte)uVar15;
        bVar23 = (byte)(uVar45 >> 8);
        bVar69 = (byte)((ulong)uVar15 >> 8);
        bVar24 = (byte)(uVar45 >> 0x10);
        bVar70 = (byte)((ulong)uVar15 >> 0x10);
        bVar25 = (byte)(uVar45 >> 0x18);
        bVar71 = (byte)((ulong)uVar15 >> 0x18);
        bVar26 = (byte)(uVar45 >> 0x20);
        bVar72 = (byte)((ulong)uVar15 >> 0x20);
        bVar27 = (byte)(uVar45 >> 0x28);
        bVar74 = (byte)((ulong)uVar15 >> 0x28);
        bVar28 = (byte)(uVar45 >> 0x30);
        bVar75 = (byte)((ulong)uVar15 >> 0x30);
        bVar33 = (byte)((ulong)uVar15 >> 0x38);
        bVar29 = (byte)(uVar45 >> 0x38);
        auVar113[0] = -((byte)((bVar37 < bVar60) * bVar37 | (bVar37 >= bVar60) * bVar60) == bVar37);
        auVar113[1] = -((byte)((bVar23 < bVar69) * bVar23 | (bVar23 >= bVar69) * bVar69) == bVar23);
        auVar113[2] = -((byte)((bVar24 < bVar70) * bVar24 | (bVar24 >= bVar70) * bVar70) == bVar24);
        auVar113[3] = -((byte)((bVar25 < bVar71) * bVar25 | (bVar25 >= bVar71) * bVar71) == bVar25);
        auVar113[4] = -((byte)((bVar26 < bVar72) * bVar26 | (bVar26 >= bVar72) * bVar72) == bVar26);
        auVar113[5] = -((byte)((bVar27 < bVar74) * bVar27 | (bVar27 >= bVar74) * bVar74) == bVar27);
        auVar113[6] = -((byte)((bVar28 < bVar75) * bVar28 | (bVar28 >= bVar75) * bVar75) == bVar28);
        auVar113[7] = -((byte)((bVar29 < bVar33) * bVar29 | (bVar29 >= bVar33) * bVar33) == bVar29);
        auVar113[8] = 0xff;
        auVar113[9] = 0xff;
        auVar113[10] = 0xff;
        auVar113[0xb] = 0xff;
        auVar113[0xc] = 0xff;
        auVar113[0xd] = 0xff;
        auVar113[0xe] = 0xff;
        auVar113[0xf] = 0xff;
        auVar46 = pmovzxbd(auVar47,auVar113 ^ auVar80);
        auVar46 = auVar46 ^ auVar80;
        auVar82._0_4_ = auVar46._0_4_ << 0x1f;
        auVar82._4_4_ = auVar46._4_4_ << 0x1f;
        auVar82._8_4_ = auVar46._8_4_ << 0x1f;
        auVar82._12_4_ = auVar46._12_4_ << 0x1f;
        uVar36 = movmskps((int)local_ae8,auVar82);
        local_ae8 = (ulong)uVar36;
        fVar59 = *(float *)(puVar39 + 3);
        fVar91 = *(float *)((long)puVar39 + 0x1c);
        fVar78 = *(float *)((long)puVar39 + 0x24);
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)((long)puVar39 + local_ad8);
        auVar46 = pmovzxbd(auVar48,auVar48);
        auVar49._8_8_ = 0;
        auVar49._0_8_ = *(ulong *)((long)puVar39 + uVar44);
        auVar47 = pmovzxbd(auVar49,auVar49);
        fVar116 = *(float *)(puVar39 + 5);
        auVar81._8_8_ = 0;
        auVar81._0_8_ = *(ulong *)((long)puVar39 + uVar13);
        auVar82 = pmovzxbd(auVar81,auVar81);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = *(ulong *)((long)puVar39 + (uVar13 ^ 4));
        auVar48 = pmovzxbd(auVar83,auVar83);
        fVar120 = *(float *)((long)puVar39 + 0x2c);
        auVar94._8_8_ = 0;
        auVar94._0_8_ = *(ulong *)((long)puVar39 + uVar14);
        auVar49 = pmovzxbd(auVar94,auVar94);
        auVar112._8_8_ = 0;
        auVar112._0_8_ = *(ulong *)((long)puVar39 + (uVar14 ^ 4));
        auVar113 = pmovzxbd(auVar112,auVar112);
        fVar121 = *(float *)(puVar39 + 4);
        fVar61 = (((float)auVar46._0_4_ * fVar78 + fVar59) - local_928) * local_948;
        fVar73 = (((float)auVar46._4_4_ * fVar78 + fVar59) - fStack_924) * fStack_944;
        fVar76 = (((float)auVar46._8_4_ * fVar78 + fVar59) - fStack_920) * fStack_940;
        fVar77 = (((float)auVar46._12_4_ * fVar78 + fVar59) - fStack_91c) * fStack_93c;
        fVar101 = (((float)auVar82._0_4_ * fVar116 + fVar91) - local_938) * local_958;
        fVar105 = (((float)auVar82._4_4_ * fVar116 + fVar91) - fStack_934) * fStack_954;
        fVar107 = (((float)auVar82._8_4_ * fVar116 + fVar91) - fStack_930) * fStack_950;
        fVar109 = (((float)auVar82._12_4_ * fVar116 + fVar91) - fStack_92c) * fStack_94c;
        uVar102 = (uint)((int)fVar101 < (int)fVar61) * (int)fVar61 |
                  (uint)((int)fVar101 >= (int)fVar61) * (int)fVar101;
        uVar106 = (uint)((int)fVar105 < (int)fVar73) * (int)fVar73 |
                  (uint)((int)fVar105 >= (int)fVar73) * (int)fVar105;
        uVar108 = (uint)((int)fVar107 < (int)fVar76) * (int)fVar76 |
                  (uint)((int)fVar107 >= (int)fVar76) * (int)fVar107;
        uVar110 = (uint)((int)fVar109 < (int)fVar77) * (int)fVar77 |
                  (uint)((int)fVar109 >= (int)fVar77) * (int)fVar109;
        fVar61 = (((float)auVar49._0_4_ * fVar120 + fVar121) - local_8f8) * local_918;
        fVar73 = (((float)auVar49._4_4_ * fVar120 + fVar121) - fStack_8f4) * fStack_914;
        fVar76 = (((float)auVar49._8_4_ * fVar120 + fVar121) - fStack_8f0) * fStack_910;
        fVar77 = (((float)auVar49._12_4_ * fVar120 + fVar121) - fStack_8ec) * fStack_90c;
        uVar93 = (uint)((int)fVar61 < (int)local_908) * (int)local_908 |
                 (uint)((int)fVar61 >= (int)local_908) * (int)fVar61;
        uVar98 = (uint)((int)fVar73 < (int)fStack_904) * (int)fStack_904 |
                 (uint)((int)fVar73 >= (int)fStack_904) * (int)fVar73;
        uVar99 = (uint)((int)fVar76 < (int)fStack_900) * (int)fStack_900 |
                 (uint)((int)fVar76 >= (int)fStack_900) * (int)fVar76;
        uVar100 = (uint)((int)fVar77 < (int)fStack_8fc) * (int)fStack_8fc |
                  (uint)((int)fVar77 >= (int)fStack_8fc) * (int)fVar77;
        fVar61 = (((float)auVar47._0_4_ * fVar78 + fVar59) - local_928) * local_948;
        fVar73 = (((float)auVar47._4_4_ * fVar78 + fVar59) - fStack_924) * fStack_944;
        fVar76 = (((float)auVar47._8_4_ * fVar78 + fVar59) - fStack_920) * fStack_940;
        fVar59 = (((float)auVar47._12_4_ * fVar78 + fVar59) - fStack_91c) * fStack_93c;
        fVar78 = (((float)auVar48._0_4_ * fVar116 + fVar91) - local_938) * local_958;
        fVar77 = (((float)auVar48._4_4_ * fVar116 + fVar91) - fStack_934) * fStack_954;
        fVar101 = (((float)auVar48._8_4_ * fVar116 + fVar91) - fStack_930) * fStack_950;
        fVar91 = (((float)auVar48._12_4_ * fVar116 + fVar91) - fStack_92c) * fStack_94c;
        uVar79 = (uint)((int)fVar61 < (int)fVar78) * (int)fVar61 |
                 (uint)((int)fVar61 >= (int)fVar78) * (int)fVar78;
        uVar89 = (uint)((int)fVar73 < (int)fVar77) * (int)fVar73 |
                 (uint)((int)fVar73 >= (int)fVar77) * (int)fVar77;
        uVar90 = (uint)((int)fVar76 < (int)fVar101) * (int)fVar76 |
                 (uint)((int)fVar76 >= (int)fVar101) * (int)fVar101;
        uVar92 = (uint)((int)fVar59 < (int)fVar91) * (int)fVar59 |
                 (uint)((int)fVar59 >= (int)fVar91) * (int)fVar91;
        fVar59 = (((float)auVar113._0_4_ * fVar120 + fVar121) - local_8f8) * local_918;
        fVar91 = (((float)auVar113._4_4_ * fVar120 + fVar121) - fStack_8f4) * fStack_914;
        fVar78 = (((float)auVar113._8_4_ * fVar120 + fVar121) - fStack_8f0) * fStack_910;
        fVar116 = (((float)auVar113._12_4_ * fVar120 + fVar121) - fStack_8ec) * fStack_90c;
        uVar111 = (uint)((int)local_8e8 < (int)fVar59) * (int)local_8e8 |
                  (uint)((int)local_8e8 >= (int)fVar59) * (int)fVar59;
        uVar114 = (uint)((int)fStack_8e4 < (int)fVar91) * (int)fStack_8e4 |
                  (uint)((int)fStack_8e4 >= (int)fVar91) * (int)fVar91;
        uVar115 = (uint)((int)fStack_8e0 < (int)fVar78) * (int)fStack_8e0 |
                  (uint)((int)fStack_8e0 >= (int)fVar78) * (int)fVar78;
        uVar117 = (uint)((int)fStack_8dc < (int)fVar116) * (int)fStack_8dc |
                  (uint)((int)fStack_8dc >= (int)fVar116) * (int)fVar116;
        auVar95._0_4_ =
             -(uint)((int)(((int)uVar79 < (int)uVar111) * uVar79 |
                          ((int)uVar79 >= (int)uVar111) * uVar111) <
                    (int)(((int)uVar93 < (int)uVar102) * uVar102 |
                         ((int)uVar93 >= (int)uVar102) * uVar93));
        auVar95._4_4_ =
             -(uint)((int)(((int)uVar89 < (int)uVar114) * uVar89 |
                          ((int)uVar89 >= (int)uVar114) * uVar114) <
                    (int)(((int)uVar98 < (int)uVar106) * uVar106 |
                         ((int)uVar98 >= (int)uVar106) * uVar98));
        auVar95._8_4_ =
             -(uint)((int)(((int)uVar90 < (int)uVar115) * uVar90 |
                          ((int)uVar90 >= (int)uVar115) * uVar115) <
                    (int)(((int)uVar99 < (int)uVar108) * uVar108 |
                         ((int)uVar99 >= (int)uVar108) * uVar99));
        auVar95._12_4_ =
             -(uint)((int)(((int)uVar92 < (int)uVar117) * uVar92 |
                          ((int)uVar92 >= (int)uVar117) * uVar117) <
                    (int)(((int)uVar100 < (int)uVar110) * uVar110 |
                         ((int)uVar100 >= (int)uVar110) * uVar100));
        uVar38 = movmskps((int)puVar39,auVar95);
        bVar37 = ~(byte)uVar38 & (byte)uVar36;
        if (bVar37 == 0) goto LAB_006af1b4;
        lVar21 = 0;
        if (bVar37 != 0) {
          for (; (bVar37 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
          }
        }
        uVar45 = *(ulong *)(uVar34 + lVar21 * 8);
        uVar36 = bVar37 - 1 & (uint)bVar37;
        local_ae8 = (ulong)uVar36;
        if (uVar36 != 0) {
          do {
            *local_ad0 = uVar45;
            local_ad0 = local_ad0 + 1;
            lVar21 = 0;
            if (local_ae8 != 0) {
              for (; (local_ae8 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            uVar45 = *(ulong *)(uVar34 + lVar21 * 8);
            local_ae8 = local_ae8 - 1 & local_ae8;
          } while (local_ae8 != 0);
        }
      }
      local_ae0 = (ulong)((uint)uVar45 & 0xf) - 8;
      for (local_ae8 = 0; local_ae8 != local_ae0; local_ae8 = local_ae8 + 1) {
        local_bf0 = context;
        pSVar41 = context->scene;
        puVar1 = (uint *)((uVar45 & 0xfffffffffffffff0) + local_ae8 * 0x60);
        puVar42 = puVar1 + 0x10;
        local_bf8 = pSVar41;
        ppfVar17 = (pSVar41->vertices).items;
        pfVar18 = ppfVar17[*puVar42];
        pfVar2 = pfVar18 + *puVar1;
        pfVar3 = pfVar18 + puVar1[4];
        pfVar4 = pfVar18 + puVar1[0xc];
        pfVar35 = ppfVar17[puVar1[0x11]];
        pfVar5 = pfVar35 + puVar1[1];
        pfVar6 = pfVar35 + puVar1[5];
        pfVar7 = pfVar35 + puVar1[0xd];
        pfVar19 = ppfVar17[puVar1[0x12]];
        pfVar8 = pfVar19 + puVar1[2];
        pfVar9 = pfVar19 + puVar1[0xe];
        pfVar20 = ppfVar17[puVar1[0x13]];
        pfVar10 = pfVar20 + puVar1[3];
        pfVar11 = pfVar20 + puVar1[0xf];
        local_b38 = CONCAT44(*pfVar6,*pfVar3);
        local_bc8 = (ray->org).field_0.m128[0];
        local_a58 = (ray->org).field_0.m128[1];
        local_a48 = (ray->org).field_0.m128[2];
        local_b18._0_4_ = pfVar2[1] - local_a58;
        local_b18._4_4_ = pfVar5[1] - local_a58;
        fStack_b10 = pfVar8[1] - local_a58;
        fStack_b0c = pfVar10[1] - local_a58;
        local_af8 = pfVar2[2] - local_a48;
        fStack_af4 = pfVar5[2] - local_a48;
        fStack_af0 = pfVar8[2] - local_a48;
        fStack_aec = pfVar10[2] - local_a48;
        fStack_8c0 = pfVar9[1];
        fStack_8bc = pfVar11[1];
        local_c38._0_4_ = pfVar4[1] - local_a58;
        local_c38._4_4_ = pfVar7[1] - local_a58;
        fStack_c30 = pfVar9[1] - local_a58;
        fStack_c2c = pfVar11[1] - local_a58;
        local_8a8 = CONCAT44(pfVar7[2],pfVar4[2]);
        local_bd8._0_4_ = pfVar4[2] - local_a48;
        local_bd8._4_4_ = pfVar7[2] - local_a48;
        fStack_bd0 = pfVar9[2] - local_a48;
        fStack_bcc = pfVar11[2] - local_a48;
        local_808 = (float)local_c38 - (float)local_b18._0_4_;
        fStack_804 = local_c38._4_4_ - (float)local_b18._4_4_;
        fStack_800 = fStack_c30 - fStack_b10;
        fStack_7fc = fStack_c2c - fStack_b0c;
        local_7f8 = (float)local_bd8._0_4_ - local_af8;
        fStack_7f4 = (float)local_bd8._4_4_ - fStack_af4;
        fStack_7f0 = fStack_bd0 - fStack_af0;
        fStack_7ec = fStack_bcc - fStack_aec;
        fStack_bc4 = local_bc8;
        fStack_bc0 = local_bc8;
        fStack_bbc = local_bc8;
        local_b08 = *pfVar2 - local_bc8;
        fStack_b04 = *pfVar5 - local_bc8;
        fStack_b00 = *pfVar8 - local_bc8;
        fStack_afc = *pfVar10 - local_bc8;
        local_8d8 = CONCAT44(*pfVar7,*pfVar4);
        local_8c8 = *pfVar9;
        fStack_8c4 = *pfVar11;
        local_a68 = *pfVar4 - local_bc8;
        fStack_a64 = *pfVar7 - local_bc8;
        fStack_a60 = *pfVar9 - local_bc8;
        fStack_a5c = *pfVar11 - local_bc8;
        local_818 = local_a68 - local_b08;
        fStack_814 = fStack_a64 - fStack_b04;
        fStack_810 = fStack_a60 - fStack_b00;
        fStack_80c = fStack_a5c - fStack_afc;
        local_c58 = (ray->dir).field_0.m128[0];
        local_c18 = (ray->dir).field_0.m128[1];
        local_be8 = (ray->dir).field_0.m128[2];
        fStack_c54 = local_c58;
        fStack_c50 = local_c58;
        fStack_c4c = local_c58;
        fVar107 = (local_808 * ((float)local_bd8._0_4_ + local_af8) -
                  local_7f8 * ((float)local_c38 + (float)local_b18._0_4_)) * local_c58 +
                  (local_7f8 * (local_a68 + local_b08) -
                  ((float)local_bd8._0_4_ + local_af8) * local_818) * local_c18 +
                  (((float)local_c38 + (float)local_b18._0_4_) * local_818 -
                  (local_a68 + local_b08) * local_808) * local_be8;
        fVar109 = (fStack_804 * ((float)local_bd8._4_4_ + fStack_af4) -
                  fStack_7f4 * (local_c38._4_4_ + (float)local_b18._4_4_)) * local_c58 +
                  (fStack_7f4 * (fStack_a64 + fStack_b04) -
                  ((float)local_bd8._4_4_ + fStack_af4) * fStack_814) * local_c18 +
                  ((local_c38._4_4_ + (float)local_b18._4_4_) * fStack_814 -
                  (fStack_a64 + fStack_b04) * fStack_804) * local_be8;
        local_a38._0_8_ = CONCAT44(fVar109,fVar107);
        local_a38._8_4_ =
             (fStack_800 * (fStack_bd0 + fStack_af0) - fStack_7f0 * (fStack_c30 + fStack_b10)) *
             local_c58 +
             (fStack_7f0 * (fStack_a60 + fStack_b00) - (fStack_bd0 + fStack_af0) * fStack_810) *
             local_c18 +
             ((fStack_c30 + fStack_b10) * fStack_810 - (fStack_a60 + fStack_b00) * fStack_800) *
             local_be8;
        fStack_a2c = (fStack_7fc * (fStack_bcc + fStack_aec) -
                     fStack_7ec * (fStack_c2c + fStack_b0c)) * local_c58 +
                     (fStack_7ec * (fStack_a5c + fStack_afc) -
                     (fStack_bcc + fStack_aec) * fStack_80c) * local_c18 +
                     ((fStack_c2c + fStack_b0c) * fStack_80c -
                     (fStack_a5c + fStack_afc) * fStack_7fc) * local_be8;
        local_8b8 = pfVar3[1];
        fStack_8b4 = pfVar6[1];
        fStack_8b0 = pfVar19[(ulong)puVar1[6] + 1];
        fStack_8ac = pfVar20[(ulong)puVar1[7] + 1];
        fStack_a54 = local_a58;
        fStack_a50 = local_a58;
        fStack_a4c = local_a58;
        local_aa8 = pfVar3[1] - local_a58;
        fStack_aa4 = pfVar6[1] - local_a58;
        fStack_aa0 = pfVar19[(ulong)puVar1[6] + 1] - local_a58;
        fStack_a9c = pfVar20[(ulong)puVar1[7] + 1] - local_a58;
        local_898 = CONCAT44(pfVar6[2],pfVar3[2]);
        fStack_a44 = local_a48;
        fStack_a40 = local_a48;
        fStack_a3c = local_a48;
        local_ac8 = pfVar3[2] - local_a48;
        fStack_ac4 = pfVar6[2] - local_a48;
        fStack_ac0 = pfVar19[(ulong)puVar1[6] + 2] - local_a48;
        fStack_abc = pfVar20[(ulong)puVar1[7] + 2] - local_a48;
        fVar120 = (float)local_b18._0_4_ - local_aa8;
        fVar61 = (float)local_b18._4_4_ - fStack_aa4;
        fVar76 = fStack_b10 - fStack_aa0;
        fVar101 = fStack_b0c - fStack_a9c;
        local_b28 = local_af8 - local_ac8;
        fStack_b24 = fStack_af4 - fStack_ac4;
        fStack_b20 = fStack_af0 - fStack_ac0;
        fStack_b1c = fStack_aec - fStack_abc;
        local_ab8 = *pfVar3 - local_bc8;
        fStack_ab4 = *pfVar6 - local_bc8;
        fStack_ab0 = fStack_b30 - local_bc8;
        fStack_aac = fStack_b2c - local_bc8;
        local_838 = local_b08 - local_ab8;
        fStack_834 = fStack_b04 - fStack_ab4;
        fStack_830 = fStack_b00 - fStack_ab0;
        fStack_82c = fStack_afc - fStack_aac;
        fVar134 = (fVar120 * (local_af8 + local_ac8) -
                  local_b28 * ((float)local_b18._0_4_ + local_aa8)) * local_c58 +
                  (local_b28 * (local_b08 + local_ab8) - (local_af8 + local_ac8) * local_838) *
                  local_c18 +
                  (((float)local_b18._0_4_ + local_aa8) * local_838 -
                  (local_b08 + local_ab8) * fVar120) * local_be8;
        fVar139 = (fVar61 * (fStack_af4 + fStack_ac4) -
                  fStack_b24 * ((float)local_b18._4_4_ + fStack_aa4)) * local_c58 +
                  (fStack_b24 * (fStack_b04 + fStack_ab4) - (fStack_af4 + fStack_ac4) * fStack_834)
                  * local_c18 +
                  (((float)local_b18._4_4_ + fStack_aa4) * fStack_834 -
                  (fStack_b04 + fStack_ab4) * fVar61) * local_be8;
        local_848._0_8_ = CONCAT44(fVar139,fVar134);
        local_848._8_4_ =
             (fVar76 * (fStack_af0 + fStack_ac0) - fStack_b20 * (fStack_b10 + fStack_aa0)) *
             local_c58 +
             (fStack_b20 * (fStack_b00 + fStack_ab0) - (fStack_af0 + fStack_ac0) * fStack_830) *
             local_c18 +
             ((fStack_b10 + fStack_aa0) * fStack_830 - (fStack_b00 + fStack_ab0) * fVar76) *
             local_be8;
        local_848._12_4_ =
             (fVar101 * (fStack_aec + fStack_abc) - fStack_b1c * (fStack_b0c + fStack_a9c)) *
             local_c58 +
             (fStack_b1c * (fStack_afc + fStack_aac) - (fStack_aec + fStack_abc) * fStack_82c) *
             local_c18 +
             ((fStack_b0c + fStack_a9c) * fStack_82c - (fStack_afc + fStack_aac) * fVar101) *
             local_be8;
        fVar144 = local_aa8 - (float)local_c38;
        fVar146 = fStack_aa4 - local_c38._4_4_;
        fVar147 = fStack_aa0 - fStack_c30;
        fVar148 = fStack_a9c - fStack_c2c;
        local_828 = local_ac8 - (float)local_bd8._0_4_;
        fStack_824 = fStack_ac4 - (float)local_bd8._4_4_;
        fStack_820 = fStack_ac0 - fStack_bd0;
        fStack_81c = fStack_abc - fStack_bcc;
        local_a78 = local_aa8 + (float)local_c38;
        fStack_a74 = fStack_aa4 + local_c38._4_4_;
        fStack_a70 = fStack_aa0 + fStack_c30;
        fStack_a6c = fStack_a9c + fStack_c2c;
        local_a88 = local_ac8 + (float)local_bd8._0_4_;
        fStack_a84 = fStack_ac4 + (float)local_bd8._4_4_;
        fStack_a80 = fStack_ac0 + fStack_bd0;
        fStack_a7c = fStack_abc + fStack_bcc;
        fVar121 = local_ab8 - local_a68;
        fVar73 = fStack_ab4 - fStack_a64;
        fVar77 = fStack_ab0 - fStack_a60;
        fVar105 = fStack_aac - fStack_a5c;
        local_a98 = local_ab8 + local_a68;
        fStack_a94 = fStack_ab4 + fStack_a64;
        fStack_a90 = fStack_ab0 + fStack_a60;
        fStack_a8c = fStack_aac + fStack_a5c;
        fStack_be4 = local_be8;
        fStack_be0 = local_be8;
        fStack_bdc = local_be8;
        fStack_c14 = local_c18;
        fStack_c10 = local_c18;
        fStack_c0c = local_c18;
        auVar50._0_4_ =
             (fVar144 * local_a88 - local_828 * local_a78) * local_c58 +
             (local_828 * local_a98 - fVar121 * local_a88) * local_c18 +
             (fVar121 * local_a78 - fVar144 * local_a98) * local_be8;
        auVar50._4_4_ =
             (fVar146 * fStack_a84 - fStack_824 * fStack_a74) * local_c58 +
             (fStack_824 * fStack_a94 - fVar73 * fStack_a84) * local_c18 +
             (fVar73 * fStack_a74 - fVar146 * fStack_a94) * local_be8;
        auVar50._8_4_ =
             (fVar147 * fStack_a80 - fStack_820 * fStack_a70) * local_c58 +
             (fStack_820 * fStack_a90 - fVar77 * fStack_a80) * local_c18 +
             (fVar77 * fStack_a70 - fVar147 * fStack_a90) * local_be8;
        auVar50._12_4_ =
             (fVar148 * fStack_a7c - fStack_81c * fStack_a6c) * local_c58 +
             (fStack_81c * fStack_a8c - fVar105 * fStack_a7c) * local_c18 +
             (fVar105 * fStack_a6c - fVar148 * fStack_a8c) * local_be8;
        local_a18._0_4_ = fVar107 + fVar134 + auVar50._0_4_;
        local_a18._4_4_ = fVar109 + fVar139 + auVar50._4_4_;
        local_a18._8_4_ = (float)local_a38._8_4_ + local_848._8_4_ + auVar50._8_4_;
        local_a18._12_4_ = fStack_a2c + local_848._12_4_ + auVar50._12_4_;
        auVar62._8_4_ = local_a38._8_4_;
        auVar62._0_8_ = local_a38._0_8_;
        auVar62._12_4_ = fStack_a2c;
        auVar46 = minps(auVar62,local_848);
        auVar46 = minps(auVar46,auVar50);
        auVar126._8_4_ = local_a38._8_4_;
        auVar126._0_8_ = local_a38._0_8_;
        auVar126._12_4_ = fStack_a2c;
        auVar80 = maxps(auVar126,local_848);
        auVar80 = maxps(auVar80,auVar50);
        fVar59 = ABS(local_a18._0_4_) * 1.1920929e-07;
        fVar91 = ABS(local_a18._4_4_) * 1.1920929e-07;
        fVar78 = ABS(local_a18._8_4_) * 1.1920929e-07;
        fVar116 = ABS(local_a18._12_4_) * 1.1920929e-07;
        auVar127._4_4_ = -(uint)(auVar80._4_4_ <= fVar91);
        auVar127._0_4_ = -(uint)(auVar80._0_4_ <= fVar59);
        auVar127._8_4_ = -(uint)(auVar80._8_4_ <= fVar78);
        auVar127._12_4_ = -(uint)(auVar80._12_4_ <= fVar116);
        auVar63._4_4_ = -(uint)(-fVar91 <= auVar46._4_4_);
        auVar63._0_4_ = -(uint)(-fVar59 <= auVar46._0_4_);
        auVar63._8_4_ = -(uint)(-fVar78 <= auVar46._8_4_);
        auVar63._12_4_ = -(uint)(-fVar116 <= auVar46._12_4_);
        auVar127 = auVar127 | auVar63;
        local_b40 = (uVar45 & 0xfffffffffffffff0) + local_ae8 * 0x60;
        local_c00 = puVar42;
        iVar43 = movmskps((int)local_7d8,auVar127);
        pauVar12 = (undefined1 (*) [12])(pfVar18 + puVar1[8]);
        auVar125 = *pauVar12;
        local_c28 = (float)*(undefined8 *)*pauVar12;
        fStack_c24 = (float)((ulong)*(undefined8 *)*pauVar12 >> 0x20);
        fStack_c20 = (float)*(undefined8 *)(*pauVar12 + 8);
        fStack_c1c = (float)((ulong)*(undefined8 *)(*pauVar12 + 8) >> 0x20);
        local_b58 = *(undefined8 *)(pfVar35 + puVar1[9]);
        uStack_b50 = *(undefined8 *)(pfVar35 + puVar1[9] + 2);
        local_888 = *(undefined8 *)(pfVar19 + puVar1[10]);
        uStack_880 = *(undefined8 *)(pfVar19 + puVar1[10] + 2);
        local_878 = *(undefined8 *)(pfVar20 + puVar1[0xb]);
        uStack_870 = *(undefined8 *)(pfVar20 + puVar1[0xb] + 2);
        if (iVar43 == 0) {
          auVar86._4_4_ = local_c58;
          auVar86._0_4_ = local_c58;
          auVar86._8_4_ = local_c58;
          auVar86._12_4_ = local_c58;
        }
        else {
          local_858 = fVar144;
          fStack_854 = fVar146;
          fStack_850 = fVar147;
          fStack_84c = fVar148;
          auVar103._0_4_ = local_808 * local_b28 - local_7f8 * fVar120;
          auVar103._4_4_ = fStack_804 * fStack_b24 - fStack_7f4 * fVar61;
          auVar103._8_4_ = fStack_800 * fStack_b20 - fStack_7f0 * fVar76;
          auVar103._12_4_ = fStack_7fc * fStack_b1c - fStack_7ec * fVar101;
          auVar96._0_4_ = fVar120 * local_828 - local_b28 * fVar144;
          auVar96._4_4_ = fVar61 * fStack_824 - fStack_b24 * fVar146;
          auVar96._8_4_ = fVar76 * fStack_820 - fStack_b20 * fVar147;
          auVar96._12_4_ = fVar101 * fStack_81c - fStack_b1c * fVar148;
          auVar51._4_4_ = -(uint)(ABS(fStack_7f4 * fVar61) < ABS(fStack_b24 * fVar146));
          auVar51._0_4_ = -(uint)(ABS(local_7f8 * fVar120) < ABS(local_b28 * fVar144));
          auVar51._8_4_ = -(uint)(ABS(fStack_7f0 * fVar76) < ABS(fStack_b20 * fVar147));
          auVar51._12_4_ = -(uint)(ABS(fStack_7ec * fVar101) < ABS(fStack_b1c * fVar148));
          _local_c48 = blendvps(auVar96,auVar103,auVar51);
          auVar130._0_4_ = local_7f8 * local_838 - local_818 * local_b28;
          auVar130._4_4_ = fStack_7f4 * fStack_834 - fStack_814 * fStack_b24;
          auVar130._8_4_ = fStack_7f0 * fStack_830 - fStack_810 * fStack_b20;
          auVar130._12_4_ = fStack_7ec * fStack_82c - fStack_80c * fStack_b1c;
          auVar137._0_4_ = local_b28 * fVar121 - local_838 * local_828;
          auVar137._4_4_ = fStack_b24 * fVar73 - fStack_834 * fStack_824;
          auVar137._8_4_ = fStack_b20 * fVar77 - fStack_830 * fStack_820;
          auVar137._12_4_ = fStack_b1c * fVar105 - fStack_82c * fStack_81c;
          auVar52._4_4_ = -(uint)(ABS(fStack_814 * fStack_b24) < ABS(fStack_834 * fStack_824));
          auVar52._0_4_ = -(uint)(ABS(local_818 * local_b28) < ABS(local_838 * local_828));
          auVar52._8_4_ = -(uint)(ABS(fStack_810 * fStack_b20) < ABS(fStack_830 * fStack_820));
          auVar52._12_4_ = -(uint)(ABS(fStack_80c * fStack_b1c) < ABS(fStack_82c * fStack_81c));
          local_9f8 = blendvps(auVar137,auVar130,auVar52);
          auVar118._0_4_ = local_818 * fVar120 - local_808 * local_838;
          auVar118._4_4_ = fStack_814 * fVar61 - fStack_804 * fStack_834;
          auVar118._8_4_ = fStack_810 * fVar76 - fStack_800 * fStack_830;
          auVar118._12_4_ = fStack_80c * fVar101 - fStack_7fc * fStack_82c;
          auVar104._0_4_ = local_838 * fVar144 - fVar120 * fVar121;
          auVar104._4_4_ = fStack_834 * fVar146 - fVar61 * fVar73;
          auVar104._8_4_ = fStack_830 * fVar147 - fVar76 * fVar77;
          auVar104._12_4_ = fStack_82c * fVar148 - fVar101 * fVar105;
          auVar53._4_4_ = -(uint)(ABS(fStack_804 * fStack_834) < ABS(fVar61 * fVar73));
          auVar53._0_4_ = -(uint)(ABS(local_808 * local_838) < ABS(fVar120 * fVar121));
          auVar53._8_4_ = -(uint)(ABS(fStack_800 * fStack_830) < ABS(fVar76 * fVar77));
          auVar53._12_4_ = -(uint)(ABS(fStack_7fc * fStack_82c) < ABS(fVar101 * fVar105));
          local_9e8 = blendvps(auVar104,auVar118,auVar53);
          auVar86._4_4_ = local_c58;
          auVar86._0_4_ = local_c58;
          auVar86._8_4_ = local_c58;
          auVar86._12_4_ = local_c58;
          fVar59 = local_c58 * local_c48._0_4_ +
                   local_c18 * local_9f8._0_4_ + local_be8 * local_9e8._0_4_;
          fVar91 = local_c58 * local_c48._4_4_ +
                   local_c18 * local_9f8._4_4_ + local_be8 * local_9e8._4_4_;
          fVar78 = local_c58 * local_c48._8_4_ +
                   local_c18 * local_9f8._8_4_ + local_be8 * local_9e8._8_4_;
          fVar116 = local_c58 * local_c48._12_4_ +
                    local_c18 * local_9f8._12_4_ + local_be8 * local_9e8._12_4_;
          auVar54._0_4_ = fVar59 + fVar59;
          auVar54._4_4_ = fVar91 + fVar91;
          auVar54._8_4_ = fVar78 + fVar78;
          auVar54._12_4_ = fVar116 + fVar116;
          auVar84._0_4_ = (float)local_b18._0_4_ * local_9f8._0_4_ + local_af8 * local_9e8._0_4_;
          auVar84._4_4_ = (float)local_b18._4_4_ * local_9f8._4_4_ + fStack_af4 * local_9e8._4_4_;
          auVar84._8_4_ = fStack_b10 * local_9f8._8_4_ + fStack_af0 * local_9e8._8_4_;
          auVar84._12_4_ = fStack_b0c * local_9f8._12_4_ + fStack_aec * local_9e8._12_4_;
          fVar76 = local_b08 * local_c48._0_4_ + auVar84._0_4_;
          fVar77 = fStack_b04 * local_c48._4_4_ + auVar84._4_4_;
          fVar101 = fStack_b00 * local_c48._8_4_ + auVar84._8_4_;
          fVar105 = fStack_afc * local_c48._12_4_ + auVar84._12_4_;
          auVar46 = rcpps(auVar84,auVar54);
          fVar59 = auVar46._0_4_;
          fVar91 = auVar46._4_4_;
          fVar116 = auVar46._8_4_;
          fVar120 = auVar46._12_4_;
          fVar121 = (float)DAT_01f46a60;
          fVar61 = DAT_01f46a60._4_4_;
          fVar73 = DAT_01f46a60._12_4_;
          fVar78 = DAT_01f46a60._8_4_;
          local_9a8._0_4_ =
               ((fVar121 - auVar54._0_4_ * fVar59) * fVar59 + fVar59) * (fVar76 + fVar76);
          local_9a8._4_4_ =
               ((fVar61 - auVar54._4_4_ * fVar91) * fVar91 + fVar91) * (fVar77 + fVar77);
          fStack_9a0 = ((fVar78 - auVar54._8_4_ * fVar116) * fVar116 + fVar116) *
                       (fVar101 + fVar101);
          fStack_99c = ((fVar73 - auVar54._12_4_ * fVar120) * fVar120 + fVar120) *
                       (fVar105 + fVar105);
          fVar59 = ray->tfar;
          fVar91 = (ray->org).field_0.m128[3];
          local_9d8._0_4_ =
               -(uint)(auVar54._0_4_ != 0.0) & auVar127._0_4_ &
               -(uint)((float)local_9a8._0_4_ <= fVar59 && fVar91 <= (float)local_9a8._0_4_);
          local_9d8._4_4_ =
               -(uint)(auVar54._4_4_ != 0.0) & auVar127._4_4_ &
               -(uint)((float)local_9a8._4_4_ <= fVar59 && fVar91 <= (float)local_9a8._4_4_);
          local_9d8._8_4_ =
               -(uint)(auVar54._8_4_ != 0.0) & auVar127._8_4_ &
               -(uint)(fStack_9a0 <= fVar59 && fVar91 <= fStack_9a0);
          local_9d8._12_4_ =
               -(uint)(auVar54._12_4_ != 0.0) & auVar127._12_4_ &
               -(uint)(fStack_99c <= fVar59 && fVar91 <= fStack_99c);
          uVar36 = movmskps((int)pfVar35,local_9d8);
          pfVar35 = (float *)(ulong)uVar36;
          auVar128._12_4_ = fStack_c1c;
          auVar128._0_12_ = *pauVar12;
          auVar125 = *pauVar12;
          if (uVar36 != 0) {
            local_a28._8_4_ = local_848._8_4_;
            local_a28._0_8_ = local_848._0_8_;
            fStack_a1c = local_848._12_4_;
            local_a08 = _local_c48;
            local_968._8_8_ = uStack_7e0;
            local_968._0_8_ = local_7e8;
            auVar46 = rcpps(auVar86,local_a18);
            fVar59 = auVar46._0_4_;
            fVar91 = auVar46._4_4_;
            fVar116 = auVar46._8_4_;
            fVar120 = auVar46._12_4_;
            fVar59 = (float)(-(uint)(1e-18 <= ABS(local_a18._0_4_)) &
                            (uint)((fVar121 - local_a18._0_4_ * fVar59) * fVar59 + fVar59));
            fVar91 = (float)(-(uint)(1e-18 <= ABS(local_a18._4_4_)) &
                            (uint)((fVar61 - local_a18._4_4_ * fVar91) * fVar91 + fVar91));
            fVar116 = (float)(-(uint)(1e-18 <= ABS(local_a18._8_4_)) &
                             (uint)((fVar78 - local_a18._8_4_ * fVar116) * fVar116 + fVar116));
            fVar120 = (float)(-(uint)(1e-18 <= ABS(local_a18._12_4_)) &
                             (uint)((fVar73 - local_a18._12_4_ * fVar120) * fVar120 + fVar120));
            auVar132._0_4_ = fVar107 * fVar59;
            auVar132._4_4_ = fVar109 * fVar91;
            auVar132._8_4_ = (float)local_a38._8_4_ * fVar116;
            auVar132._12_4_ = fStack_a2c * fVar120;
            auVar46 = minps(auVar132,_DAT_01f46a60);
            auVar145._0_4_ = fVar59 * fVar134;
            auVar145._4_4_ = fVar91 * fVar139;
            auVar145._8_4_ = fVar116 * local_848._8_4_;
            auVar145._12_4_ = fVar120 * local_848._12_4_;
            auVar80 = minps(auVar145,_DAT_01f46a60);
            auVar64._0_4_ = fVar121 - auVar46._0_4_;
            auVar64._4_4_ = fVar61 - auVar46._4_4_;
            auVar64._8_4_ = fVar78 - auVar46._8_4_;
            auVar64._12_4_ = fVar73 - auVar46._12_4_;
            auVar85._0_4_ = fVar121 - auVar80._0_4_;
            auVar85._4_4_ = fVar61 - auVar80._4_4_;
            auVar85._8_4_ = fVar78 - auVar80._8_4_;
            auVar85._12_4_ = fVar73 - auVar80._12_4_;
            local_9c8 = blendvps(auVar46,auVar64,local_968);
            local_9b8 = blendvps(auVar80,auVar85,local_968);
            local_998 = _local_c48;
            local_988 = local_9f8;
            local_978 = local_9e8;
            uVar34 = (ulong)(byte)uVar36;
            do {
              uVar22 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              pfVar35 = (float *)(ulong)puVar42[uVar22];
              local_c38 = (pSVar41->geometries).items[(long)pfVar35].ptr;
              if ((local_c38->mask & ray->mask) == 0) {
                uVar34 = uVar34 ^ 1L << (uVar22 & 0x3f);
              }
              else {
                auVar40 = (undefined1  [8])context->args;
                if ((((RTCIntersectArguments *)auVar40)->filter == (RTCFilterFunctionN)0x0) &&
                   (local_c38->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_006b0584;
                local_c48 = (undefined1  [8])uVar34;
                local_b88.context = context->user;
                local_bb8 = *(undefined4 *)(local_998 + uVar22 * 4);
                local_bb4 = *(undefined4 *)(local_988 + uVar22 * 4);
                local_bb0 = *(undefined4 *)(local_978 + uVar22 * 4);
                local_bac = *(undefined4 *)(local_9c8 + uVar22 * 4);
                local_ba8 = *(undefined4 *)(local_9b8 + uVar22 * 4);
                local_ba4 = *(undefined4 *)(local_b40 + 0x50 + uVar22 * 4);
                local_ba0 = puVar42[uVar22];
                local_b9c = (local_b88.context)->instID[0];
                local_b98 = (local_b88.context)->instPrimID[0];
                local_be8 = ray->tfar;
                local_c18 = (float)uVar22;
                fStack_c14 = (float)(uVar22 >> 0x20);
                ray->tfar = *(float *)(local_9a8 + uVar22 * 4);
                local_c5c = -1;
                local_b88.valid = &local_c5c;
                local_b88.geometryUserPtr = local_c38->userPtr;
                local_c58 = SUB84(ray,0);
                fStack_c54 = (float)((ulong)ray >> 0x20);
                local_b88.hit = (RTCHitN *)&local_bb8;
                local_b88.N = 1;
                local_b88.ray = (RTCRayN *)ray;
                if (local_c38->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_006afc91:
                  if ((((RTCIntersectArguments *)auVar40)->filter == (RTCFilterFunctionN)0x0) ||
                     ((((((RTCIntersectArguments *)auVar40)->flags &
                        RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) == RTC_RAY_QUERY_FLAG_INCOHERENT
                       && (((local_c38->field_8).field_0x2 & 0x40) == 0)) ||
                      ((*((RTCIntersectArguments *)auVar40)->filter)(&local_b88),
                      *local_b88.valid != 0)))) goto LAB_006b057f;
                }
                else {
                  local_bd8 = auVar40;
                  (*local_c38->occlusionFilterN)(&local_b88);
                  auVar40 = local_bd8;
                  if (*local_b88.valid != 0) goto LAB_006afc91;
                }
                ray = (Ray *)CONCAT44(fStack_c54,local_c58);
                ray->tfar = local_be8;
                pfVar35 = (float *)(ulong)(uint)local_c18;
                uVar34 = (ulong)local_c48 ^ 1L << ((ulong)pfVar35 & 0x3f);
                auVar128._4_4_ = fStack_c24;
                auVar128._0_4_ = local_c28;
                auVar128._8_4_ = fStack_c20;
                auVar128._12_4_ = fStack_c1c;
                context = local_bf0;
                pSVar41 = local_bf8;
                puVar42 = local_c00;
              }
              auVar125 = auVar128._0_12_;
            } while (uVar34 != 0);
            fStack_bbc = (ray->org).field_0.m128[0];
            local_a58 = (ray->org).field_0.m128[1];
            local_a48 = (ray->org).field_0.m128[2];
            uVar38 = *(undefined4 *)&(ray->dir).field_0;
            local_c18 = (ray->dir).field_0.m128[1];
            local_be8 = (ray->dir).field_0.m128[2];
            auVar86._4_4_ = uVar38;
            auVar86._0_4_ = uVar38;
            auVar86._8_4_ = uVar38;
            auVar86._12_4_ = uVar38;
            local_c38._0_4_ = local_8c8 - local_a58;
            local_c38._4_4_ = fStack_8c4 - local_a58;
            fStack_c30 = fStack_8c0 - local_a58;
            fStack_c2c = fStack_8bc - local_a58;
            fStack_a54 = local_a58;
            fStack_a50 = local_a58;
            fStack_a4c = local_a58;
            fStack_a44 = local_a48;
            fStack_a40 = local_a48;
            fStack_a3c = local_a48;
            local_a98 = ((float)local_8d8 - fStack_bbc) + ((float)local_b38 - fStack_bbc);
            fStack_a94 = (local_8d8._4_4_ - fStack_bbc) + (local_b38._4_4_ - fStack_bbc);
            fStack_a90 = (fStack_8d0 - fStack_bbc) + (fStack_b30 - fStack_bbc);
            fStack_a8c = (fStack_8cc - fStack_bbc) + (fStack_b2c - fStack_bbc);
            local_a78 = (float)local_c38 + (local_8b8 - local_a58);
            fStack_a74 = local_c38._4_4_ + (fStack_8b4 - local_a58);
            fStack_a70 = fStack_c30 + (fStack_8b0 - local_a58);
            fStack_a6c = fStack_c2c + (fStack_8ac - local_a58);
            local_a88 = ((float)local_8a8 - local_a48) + ((float)local_898 - local_a48);
            fStack_a84 = (local_8a8._4_4_ - local_a48) + (local_898._4_4_ - local_a48);
            fStack_a80 = (fStack_8a0 - local_a48) + (fStack_890 - local_a48);
            fStack_a7c = (fStack_89c - local_a48) + (fStack_88c - local_a48);
            local_ac8 = (float)local_898 - local_a48;
            fStack_ac4 = local_898._4_4_ - local_a48;
            fStack_ac0 = fStack_890 - local_a48;
            fStack_abc = fStack_88c - local_a48;
            local_aa8 = local_8b8 - local_a58;
            fStack_aa4 = fStack_8b4 - local_a58;
            fStack_aa0 = fStack_8b0 - local_a58;
            fStack_a9c = fStack_8ac - local_a58;
            local_ab8 = (float)local_b38 - fStack_bbc;
            fStack_ab4 = local_b38._4_4_ - fStack_bbc;
            fStack_ab0 = fStack_b30 - fStack_bbc;
            fStack_aac = fStack_b2c - fStack_bbc;
            local_bd8._4_4_ = local_8a8._4_4_ - local_a48;
            local_bd8._0_4_ = (float)local_8a8 - local_a48;
            fStack_bd0 = fStack_8a0 - local_a48;
            fStack_bcc = fStack_89c - local_a48;
            local_a68 = (float)local_8d8 - fStack_bbc;
            fStack_a64 = local_8d8._4_4_ - fStack_bbc;
            fStack_a60 = fStack_8d0 - fStack_bbc;
            fStack_a5c = fStack_8cc - fStack_bbc;
          }
        }
        fStack_c14 = local_c18;
        fStack_c10 = local_c18;
        fStack_c0c = local_c18;
        fStack_be4 = local_be8;
        fStack_be0 = local_be8;
        fStack_bdc = local_be8;
        local_c28 = auVar125._8_4_ - fStack_a3c;
        fStack_c24 = (float)uStack_b50 - fStack_a3c;
        fStack_c20 = (float)uStack_880 - fStack_a3c;
        fStack_c1c = (float)uStack_870 - fStack_a3c;
        fVar149 = auVar125._0_4_ - fStack_bbc;
        fVar151 = (float)local_b58 - fStack_bbc;
        fVar152 = (float)local_888 - fStack_bbc;
        fVar153 = (float)local_878 - fStack_bbc;
        local_af8 = auVar125._4_4_ - fStack_a4c;
        fStack_af4 = local_b58._4_4_ - fStack_a4c;
        fStack_af0 = local_888._4_4_ - fStack_a4c;
        fStack_aec = local_878._4_4_ - fStack_a4c;
        fVar101 = local_aa8 - local_af8;
        fVar105 = fStack_aa4 - fStack_af4;
        fVar107 = fStack_aa0 - fStack_af0;
        fVar109 = fStack_a9c - fStack_aec;
        fVar135 = local_ac8 - local_c28;
        fVar140 = fStack_ac4 - fStack_c24;
        fStack_b30 = fStack_ac0 - fStack_c20;
        fStack_b2c = fStack_abc - fStack_c1c;
        local_c58 = (float)local_c38 - local_aa8;
        fStack_c54 = local_c38._4_4_ - fStack_aa4;
        fStack_c50 = fStack_c30 - fStack_aa0;
        fStack_c4c = fStack_c2c - fStack_a9c;
        local_c48._0_4_ = (float)local_bd8._0_4_ - local_ac8;
        local_c48._4_4_ = (float)local_bd8._4_4_ - fStack_ac4;
        fStack_c40 = fStack_bd0 - fStack_ac0;
        fStack_c3c = fStack_bcc - fStack_abc;
        local_b08 = local_ab8 - fVar149;
        fStack_b04 = fStack_ab4 - fVar151;
        fStack_b00 = fStack_ab0 - fVar152;
        fStack_afc = fStack_aac - fVar153;
        local_bc8 = local_a68 - local_ab8;
        fStack_bc4 = fStack_a64 - fStack_ab4;
        fStack_bc0 = fStack_a60 - fStack_ab0;
        fStack_bbc = fStack_a5c - fStack_aac;
        local_b38 = CONCAT44(fVar140,fVar135);
        local_b58 = CONCAT44(fVar105,fVar101);
        uStack_b50 = CONCAT44(fVar109,fVar107);
        fVar120 = auVar86._0_4_;
        fVar121 = auVar86._4_4_;
        fVar61 = auVar86._8_4_;
        fVar73 = auVar86._12_4_;
        fVar76 = (fVar101 * (local_ac8 + local_c28) - fVar135 * (local_aa8 + local_af8)) * fVar120 +
                 (fVar135 * (local_ab8 + fVar149) - (local_ac8 + local_c28) * local_b08) * local_c18
                 + ((local_aa8 + local_af8) * local_b08 - (local_ab8 + fVar149) * fVar101) *
                   local_be8;
        fVar77 = (fVar105 * (fStack_ac4 + fStack_c24) - fVar140 * (fStack_aa4 + fStack_af4)) *
                 fVar121 + (fVar140 * (fStack_ab4 + fVar151) -
                           (fStack_ac4 + fStack_c24) * fStack_b04) * local_c18 +
                           ((fStack_aa4 + fStack_af4) * fStack_b04 -
                           (fStack_ab4 + fVar151) * fVar105) * local_be8;
        local_a38._0_8_ = CONCAT44(fVar77,fVar76);
        local_a38._8_4_ =
             (fVar107 * (fStack_ac0 + fStack_c20) - fStack_b30 * (fStack_aa0 + fStack_af0)) * fVar61
             + (fStack_b30 * (fStack_ab0 + fVar152) - (fStack_ac0 + fStack_c20) * fStack_b00) *
               local_c18 +
               ((fStack_aa0 + fStack_af0) * fStack_b00 - (fStack_ab0 + fVar152) * fVar107) *
               local_be8;
        fStack_a2c = (fVar109 * (fStack_abc + fStack_c1c) - fStack_b2c * (fStack_a9c + fStack_aec))
                     * fVar73 +
                     (fStack_b2c * (fStack_aac + fVar153) - (fStack_abc + fStack_c1c) * fStack_afc)
                     * local_c18 +
                     ((fStack_a9c + fStack_aec) * fStack_afc - (fStack_aac + fVar153) * fVar109) *
                     local_be8;
        fVar134 = local_af8 - (float)local_c38;
        fVar139 = fStack_af4 - local_c38._4_4_;
        fVar144 = fStack_af0 - fStack_c30;
        fVar146 = fStack_aec - fStack_c2c;
        fVar136 = local_c28 - (float)local_bd8._0_4_;
        fVar141 = fStack_c24 - (float)local_bd8._4_4_;
        fVar142 = fStack_c20 - fStack_bd0;
        fVar143 = fStack_c1c - fStack_bcc;
        fVar59 = (float)local_c38 + local_af8;
        fVar91 = local_c38._4_4_ + fStack_af4;
        fVar78 = fStack_c30 + fStack_af0;
        fVar116 = fStack_c2c + fStack_aec;
        fVar147 = fVar149 - local_a68;
        fVar148 = fVar151 - fStack_a64;
        fVar123 = fVar152 - fStack_a60;
        fVar124 = fVar153 - fStack_a5c;
        local_c38 = (Geometry *)CONCAT44(fVar151,fVar149);
        fStack_c30 = fVar152;
        fStack_c2c = fVar153;
        fStack_b10 = (float)local_a38._8_4_;
        local_b18 = (undefined1  [8])local_a38._0_8_;
        fStack_b0c = fStack_a2c;
        local_bd8._0_4_ =
             (fVar134 * ((float)local_bd8._0_4_ + local_c28) - fVar136 * fVar59) * fVar120 +
             (fVar136 * (local_a68 + fVar149) - ((float)local_bd8._0_4_ + local_c28) * fVar147) *
             local_c18 + (fVar59 * fVar147 - (local_a68 + fVar149) * fVar134) * local_be8;
        local_bd8._4_4_ =
             (fVar139 * ((float)local_bd8._4_4_ + fStack_c24) - fVar141 * fVar91) * fVar121 +
             (fVar141 * (fStack_a64 + fVar151) - ((float)local_bd8._4_4_ + fStack_c24) * fVar148) *
             local_c18 + (fVar91 * fVar148 - (fStack_a64 + fVar151) * fVar139) * local_be8;
        fStack_bd0 = (fVar144 * (fStack_bd0 + fStack_c20) - fVar142 * fVar78) * fVar61 +
                     (fVar142 * (fStack_a60 + fVar152) - (fStack_bd0 + fStack_c20) * fVar123) *
                     local_c18 + (fVar78 * fVar123 - (fStack_a60 + fVar152) * fVar144) * local_be8;
        fStack_bcc = (fVar146 * (fStack_bcc + fStack_c1c) - fVar143 * fVar116) * fVar73 +
                     (fVar143 * (fStack_a5c + fVar153) - (fStack_bcc + fStack_c1c) * fVar124) *
                     local_c18 + (fVar116 * fVar124 - (fStack_a5c + fVar153) * fVar146) * local_be8;
        auVar55._0_4_ =
             (local_c58 * local_a88 - (float)local_c48._0_4_ * local_a78) * fVar120 +
             ((float)local_c48._0_4_ * local_a98 - local_a88 * local_bc8) * local_c18 +
             (local_a78 * local_bc8 - local_a98 * local_c58) * local_be8;
        auVar55._4_4_ =
             (fStack_c54 * fStack_a84 - (float)local_c48._4_4_ * fStack_a74) * fVar121 +
             ((float)local_c48._4_4_ * fStack_a94 - fStack_a84 * fStack_bc4) * local_c18 +
             (fStack_a74 * fStack_bc4 - fStack_a94 * fStack_c54) * local_be8;
        auVar55._8_4_ =
             (fStack_c50 * fStack_a80 - fStack_c40 * fStack_a70) * fVar61 +
             (fStack_c40 * fStack_a90 - fStack_a80 * fStack_bc0) * local_c18 +
             (fStack_a70 * fStack_bc0 - fStack_a90 * fStack_c50) * local_be8;
        auVar55._12_4_ =
             (fStack_c4c * fStack_a7c - fStack_c3c * fStack_a6c) * fVar73 +
             (fStack_c3c * fStack_a8c - fStack_a7c * fStack_bbc) * local_c18 +
             (fStack_a6c * fStack_bbc - fStack_a8c * fStack_c4c) * local_be8;
        local_b28 = fVar76 + (float)local_bd8._0_4_ + auVar55._0_4_;
        fStack_b24 = fVar77 + (float)local_bd8._4_4_ + auVar55._4_4_;
        fStack_b20 = (float)local_a38._8_4_ + fStack_bd0 + auVar55._8_4_;
        fStack_b1c = fStack_a2c + fStack_bcc + auVar55._12_4_;
        auVar65._8_4_ = local_a38._8_4_;
        auVar65._0_8_ = local_a38._0_8_;
        auVar65._12_4_ = fStack_a2c;
        auVar46 = minps(auVar65,_local_bd8);
        auVar46 = minps(auVar46,auVar55);
        auVar80 = maxps(_local_b18,_local_bd8);
        auVar80 = maxps(auVar80,auVar55);
        fVar59 = ABS(local_b28) * 1.1920929e-07;
        fVar91 = ABS(fStack_b24) * 1.1920929e-07;
        fVar78 = ABS(fStack_b20) * 1.1920929e-07;
        fVar116 = ABS(fStack_b1c) * 1.1920929e-07;
        auVar133._4_4_ = -(uint)(auVar80._4_4_ <= fVar91);
        auVar133._0_4_ = -(uint)(auVar80._0_4_ <= fVar59);
        auVar133._8_4_ = -(uint)(auVar80._8_4_ <= fVar78);
        auVar133._12_4_ = -(uint)(auVar80._12_4_ <= fVar116);
        auVar66._4_4_ = -(uint)(-fVar91 <= auVar46._4_4_);
        auVar66._0_4_ = -(uint)(-fVar59 <= auVar46._0_4_);
        auVar66._8_4_ = -(uint)(-fVar78 <= auVar46._8_4_);
        auVar66._12_4_ = -(uint)(-fVar116 <= auVar46._12_4_);
        auVar133 = auVar133 | auVar66;
        iVar43 = movmskps((int)pfVar35,auVar133);
        if (iVar43 != 0) {
          auVar129._0_4_ = fVar101 * fVar136 - fVar135 * fVar134;
          auVar129._4_4_ = fVar105 * fVar141 - fVar140 * fVar139;
          auVar129._8_4_ = fVar107 * fVar142 - fStack_b30 * fVar144;
          auVar129._12_4_ = fVar109 * fVar143 - fStack_b2c * fVar146;
          auVar119._0_4_ = fVar134 * (float)local_c48._0_4_ - fVar136 * local_c58;
          auVar119._4_4_ = fVar139 * (float)local_c48._4_4_ - fVar141 * fStack_c54;
          auVar119._8_4_ = fVar144 * fStack_c40 - fVar142 * fStack_c50;
          auVar119._12_4_ = fVar146 * fStack_c3c - fVar143 * fStack_c4c;
          auVar56._4_4_ = -(uint)(ABS(fVar140 * fVar139) < ABS(fVar141 * fStack_c54));
          auVar56._0_4_ = -(uint)(ABS(fVar135 * fVar134) < ABS(fVar136 * local_c58));
          auVar56._8_4_ = -(uint)(ABS(fStack_b30 * fVar144) < ABS(fVar142 * fStack_c50));
          auVar56._12_4_ = -(uint)(ABS(fStack_b2c * fVar146) < ABS(fVar143 * fStack_c4c));
          local_a08 = blendvps(auVar119,auVar129,auVar56);
          auVar138._0_4_ = fVar136 * local_bc8 - fVar147 * (float)local_c48._0_4_;
          auVar138._4_4_ = fVar141 * fStack_bc4 - fVar148 * (float)local_c48._4_4_;
          auVar138._8_4_ = fVar142 * fStack_bc0 - fVar123 * fStack_c40;
          auVar138._12_4_ = fVar143 * fStack_bbc - fVar124 * fStack_c3c;
          auVar57._4_4_ = -(uint)(ABS(fStack_b04 * fVar141) < ABS(fVar148 * (float)local_c48._4_4_))
          ;
          auVar57._0_4_ = -(uint)(ABS(local_b08 * fVar136) < ABS(fVar147 * (float)local_c48._0_4_));
          auVar57._8_4_ = -(uint)(ABS(fStack_b00 * fVar142) < ABS(fVar123 * fStack_c40));
          auVar57._12_4_ = -(uint)(ABS(fStack_afc * fVar143) < ABS(fVar124 * fStack_c3c));
          auVar30._4_4_ = fVar140 * fVar148 - fStack_b04 * fVar141;
          auVar30._0_4_ = fVar135 * fVar147 - local_b08 * fVar136;
          auVar30._8_4_ = fStack_b30 * fVar123 - fStack_b00 * fVar142;
          auVar30._12_4_ = fStack_b2c * fVar124 - fStack_afc * fVar143;
          local_9f8 = blendvps(auVar138,auVar30,auVar57);
          fVar135 = (float)DAT_01f46a60;
          fVar136 = DAT_01f46a60._4_4_;
          fVar140 = DAT_01f46a60._12_4_;
          auVar97._0_4_ = local_b08 * fVar134 - fVar101 * fVar147;
          auVar97._4_4_ = fStack_b04 * fVar139 - fVar105 * fVar148;
          auVar97._8_4_ = fStack_b00 * fVar144 - fVar107 * fVar123;
          auVar97._12_4_ = fStack_afc * fVar146 - fVar109 * fVar124;
          auVar122._0_4_ = fVar147 * local_c58 - fVar134 * local_bc8;
          auVar122._4_4_ = fVar148 * fStack_c54 - fVar139 * fStack_bc4;
          auVar122._8_4_ = fVar123 * fStack_c50 - fVar144 * fStack_bc0;
          auVar122._12_4_ = fVar124 * fStack_c4c - fVar146 * fStack_bbc;
          auVar58._4_4_ = -(uint)(ABS(fVar105 * fVar148) < ABS(fVar139 * fStack_bc4));
          auVar58._0_4_ = -(uint)(ABS(fVar101 * fVar147) < ABS(fVar134 * local_bc8));
          auVar58._8_4_ = -(uint)(ABS(fVar107 * fVar123) < ABS(fVar144 * fStack_bc0));
          auVar58._12_4_ = -(uint)(ABS(fVar109 * fVar124) < ABS(fVar146 * fStack_bbc));
          local_9e8 = blendvps(auVar122,auVar97,auVar58);
          fVar105 = fVar120 * local_a08._0_4_ +
                    local_c18 * local_9f8._0_4_ + local_be8 * local_9e8._0_4_;
          fVar107 = fVar121 * local_a08._4_4_ +
                    local_c18 * local_9f8._4_4_ + local_be8 * local_9e8._4_4_;
          fVar109 = fVar61 * local_a08._8_4_ +
                    local_c18 * local_9f8._8_4_ + local_be8 * local_9e8._8_4_;
          fVar134 = fVar73 * local_a08._12_4_ +
                    local_c18 * local_9f8._12_4_ + local_be8 * local_9e8._12_4_;
          fVar105 = fVar105 + fVar105;
          fVar107 = fVar107 + fVar107;
          fVar109 = fVar109 + fVar109;
          fVar134 = fVar134 + fVar134;
          auVar67._0_4_ = local_c28 * local_9e8._0_4_;
          auVar67._4_4_ = fStack_c24 * local_9e8._4_4_;
          auVar67._8_4_ = fStack_c20 * local_9e8._8_4_;
          auVar67._12_4_ = fStack_c1c * local_9e8._12_4_;
          fVar121 = fVar149 * local_a08._0_4_ + local_af8 * local_9f8._0_4_ + auVar67._0_4_;
          fVar61 = fVar151 * local_a08._4_4_ + fStack_af4 * local_9f8._4_4_ + auVar67._4_4_;
          fVar73 = fVar152 * local_a08._8_4_ + fStack_af0 * local_9f8._8_4_ + auVar67._8_4_;
          fVar101 = fVar153 * local_a08._12_4_ + fStack_aec * local_9f8._12_4_ + auVar67._12_4_;
          auVar31._4_4_ = fVar107;
          auVar31._0_4_ = fVar105;
          auVar31._8_4_ = fVar109;
          auVar31._12_4_ = fVar134;
          auVar46 = rcpps(auVar67,auVar31);
          fVar59 = auVar46._0_4_;
          fVar91 = auVar46._4_4_;
          fVar116 = auVar46._8_4_;
          fVar120 = auVar46._12_4_;
          fVar78 = DAT_01f46a60._8_4_;
          local_9a8._0_4_ = ((fVar135 - fVar105 * fVar59) * fVar59 + fVar59) * (fVar121 + fVar121);
          local_9a8._4_4_ = ((fVar136 - fVar107 * fVar91) * fVar91 + fVar91) * (fVar61 + fVar61);
          fStack_9a0 = ((fVar78 - fVar109 * fVar116) * fVar116 + fVar116) * (fVar73 + fVar73);
          fStack_99c = ((fVar140 - fVar134 * fVar120) * fVar120 + fVar120) * (fVar101 + fVar101);
          fVar59 = ray->tfar;
          fVar91 = (ray->org).field_0.m128[3];
          auVar87._0_4_ =
               -(uint)((float)local_9a8._0_4_ <= fVar59 && fVar91 <= (float)local_9a8._0_4_);
          auVar87._4_4_ =
               -(uint)((float)local_9a8._4_4_ <= fVar59 && fVar91 <= (float)local_9a8._4_4_);
          auVar87._8_4_ = -(uint)(fStack_9a0 <= fVar59 && fVar91 <= fStack_9a0);
          auVar87._12_4_ = -(uint)(fStack_99c <= fVar59 && fVar91 <= fStack_99c);
          local_9d8._0_4_ = -(uint)(fVar105 != 0.0) & auVar133._0_4_ & auVar87._0_4_;
          local_9d8._4_4_ = -(uint)(fVar107 != 0.0) & auVar133._4_4_ & auVar87._4_4_;
          local_9d8._8_4_ = -(uint)(fVar109 != 0.0) & auVar133._8_4_ & auVar87._8_4_;
          local_9d8._12_4_ = -(uint)(fVar134 != 0.0) & auVar133._12_4_ & auVar87._12_4_;
          auVar32._4_4_ = local_9d8._4_4_;
          auVar32._0_4_ = local_9d8._0_4_;
          auVar32._8_4_ = local_9d8._8_4_;
          auVar32._12_4_ = local_9d8._12_4_;
          uVar36 = movmskps(iVar43,auVar32);
          if (uVar36 != 0) {
            _local_a28 = _local_bd8;
            local_a18._4_4_ = fStack_b24;
            local_a18._0_4_ = local_b28;
            local_a18._8_4_ = fStack_b20;
            local_a18._12_4_ = fStack_b1c;
            local_968 = local_868;
            auVar46 = rcpps(auVar87,local_a18);
            fVar59 = auVar46._0_4_;
            fVar91 = auVar46._4_4_;
            fVar116 = auVar46._8_4_;
            fVar120 = auVar46._12_4_;
            fVar59 = (float)(-(uint)(1e-18 <= ABS(local_b28)) &
                            (uint)((fVar135 - local_b28 * fVar59) * fVar59 + fVar59));
            fVar91 = (float)(-(uint)(1e-18 <= ABS(fStack_b24)) &
                            (uint)((fVar136 - fStack_b24 * fVar91) * fVar91 + fVar91));
            fVar116 = (float)(-(uint)(1e-18 <= ABS(fStack_b20)) &
                             (uint)((fVar78 - fStack_b20 * fVar116) * fVar116 + fVar116));
            fVar120 = (float)(-(uint)(1e-18 <= ABS(fStack_b1c)) &
                             (uint)((fVar140 - fStack_b1c * fVar120) * fVar120 + fVar120));
            auVar131._0_4_ = fVar76 * fVar59;
            auVar131._4_4_ = fVar77 * fVar91;
            auVar131._8_4_ = (float)local_a38._8_4_ * fVar116;
            auVar131._12_4_ = fStack_a2c * fVar120;
            auVar46 = minps(auVar131,_DAT_01f46a60);
            auVar150._0_4_ = fVar59 * (float)local_bd8._0_4_;
            auVar150._4_4_ = fVar91 * (float)local_bd8._4_4_;
            auVar150._8_4_ = fVar116 * fStack_bd0;
            auVar150._12_4_ = fVar120 * fStack_bcc;
            auVar80 = minps(auVar150,_DAT_01f46a60);
            auVar68._0_4_ = fVar135 - auVar46._0_4_;
            auVar68._4_4_ = fVar136 - auVar46._4_4_;
            auVar68._8_4_ = fVar78 - auVar46._8_4_;
            auVar68._12_4_ = fVar140 - auVar46._12_4_;
            auVar88._0_4_ = fVar135 - auVar80._0_4_;
            auVar88._4_4_ = fVar136 - auVar80._4_4_;
            auVar88._8_4_ = fVar78 - auVar80._8_4_;
            auVar88._12_4_ = fVar140 - auVar80._12_4_;
            local_9c8 = blendvps(auVar46,auVar68,local_868);
            local_9b8 = blendvps(auVar80,auVar88,local_868);
            local_998 = local_a08;
            local_988 = local_9f8;
            local_978 = local_9e8;
            uVar34 = (ulong)(uVar36 & 0xff);
            local_a58 = fStack_a4c;
            fStack_a54 = fStack_a4c;
            fStack_a50 = fStack_a4c;
            local_a48 = fStack_a3c;
            fStack_a44 = fStack_a3c;
            fStack_a40 = fStack_a3c;
            do {
              uVar22 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              local_c38 = (pSVar41->geometries).items[puVar42[uVar22]].ptr;
              if ((local_c38->mask & ray->mask) == 0) {
                uVar34 = uVar34 ^ 1L << (uVar22 & 0x3f);
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (local_c38->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_006b0584;
                local_c48 = (undefined1  [8])context->args;
                local_c18 = (float)uVar34;
                fStack_c14 = (float)(uVar34 >> 0x20);
                local_b88.context = context->user;
                local_bb8 = *(undefined4 *)(local_998 + uVar22 * 4);
                local_bb4 = *(undefined4 *)(local_988 + uVar22 * 4);
                local_bb0 = *(undefined4 *)(local_978 + uVar22 * 4);
                local_bac = *(undefined4 *)(local_9c8 + uVar22 * 4);
                local_ba8 = *(undefined4 *)(local_9b8 + uVar22 * 4);
                local_ba4 = *(undefined4 *)(local_b40 + 0x50 + uVar22 * 4);
                local_ba0 = puVar42[uVar22];
                local_b9c = (local_b88.context)->instID[0];
                local_b98 = (local_b88.context)->instPrimID[0];
                local_be8 = ray->tfar;
                local_c28 = (float)uVar22;
                fStack_c24 = (float)(uVar22 >> 0x20);
                ray->tfar = *(float *)(local_9a8 + uVar22 * 4);
                local_c5c = -1;
                local_b88.valid = &local_c5c;
                local_b88.geometryUserPtr = local_c38->userPtr;
                local_c58 = SUB84(ray,0);
                fStack_c54 = (float)((ulong)ray >> 0x20);
                local_b88.hit = (RTCHitN *)&local_bb8;
                local_b88.N = 1;
                local_b88.ray = (RTCRayN *)ray;
                if ((local_c38->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                   ((*local_c38->occlusionFilterN)(&local_b88), *local_b88.valid != 0)) {
                  if ((*(code **)((long)local_c48 + 0x10) == (code *)0x0) ||
                     ((((*(byte *)local_c48 & 2) == 0 &&
                       (((local_c38->field_8).field_0x2 & 0x40) == 0)) ||
                      ((**(code **)((long)local_c48 + 0x10))(&local_b88), *local_b88.valid != 0))))
                  goto LAB_006b057f;
                }
                ray = (Ray *)CONCAT44(fStack_c54,local_c58);
                ray->tfar = local_be8;
                uVar34 = CONCAT44(fStack_c14,local_c18) ^ 1L << ((ulong)(uint)local_c28 & 0x3f);
                context = local_bf0;
                pSVar41 = local_bf8;
                puVar42 = local_c00;
              }
            } while (uVar34 != 0);
          }
        }
        auVar80._8_4_ = 0xffffffff;
        auVar80._0_8_ = 0xffffffffffffffff;
        auVar80._12_4_ = 0xffffffff;
      }
      goto LAB_006af1b4;
    }
  }
  return;
LAB_006b057f:
  ray = (Ray *)CONCAT44(fStack_c54,local_c58);
LAB_006b0584:
  ray->tfar = -INFINITY;
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }